

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int set_acl_option(mg_context *phys_ctx)

{
  int iVar1;
  undefined1 local_2c [8];
  usa sa;
  mg_context *phys_ctx_local;
  
  sa._20_8_ = phys_ctx;
  memset(local_2c,0,0x1c);
  local_2c._0_2_ = 10;
  iVar1 = check_acl((mg_context *)sa._20_8_,(usa *)local_2c);
  return (int)(iVar1 != -1);
}

Assistant:

static int
set_acl_option(struct mg_context *phys_ctx)
{
	union usa sa;
	memset(&sa, 0, sizeof(sa));
#if defined(USE_IPV6)
	sa.sin6.sin6_family = AF_INET6;
#else
	sa.sin.sin_family = AF_INET;
#endif
	return check_acl(phys_ctx, &sa) != -1;
}